

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

void __thiscall
t_ocaml_generator::generate_ocaml_struct_sig
          (t_ocaml_generator *this,ostream *out,t_struct *tstruct,bool is_exception)

{
  bool bVar1;
  members_type *this_00;
  ostream *poVar2;
  size_type sVar3;
  reference pptVar4;
  string *psVar5;
  t_type *type_00;
  string local_160;
  string local_140;
  undefined1 local_120 [8];
  string type;
  undefined1 local_e0 [8];
  string mname;
  allocator local_a9;
  string local_a8;
  undefined1 local_88 [8];
  string x;
  undefined1 local_58 [8];
  string tname;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  bool is_exception_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_ocaml_generator *this_local;
  
  this_00 = t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     *)((long)&tname.field_2 + 8));
  type_name_abi_cxx11_((string *)local_58,this,&tstruct->super_t_type);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"class ");
  poVar2 = std::operator<<(poVar2,(string *)local_58);
  poVar2 = std::operator<<(poVar2," :");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"object (\'a)");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"_x",&local_a9);
  t_generator::tmp((string *)local_88,(t_generator *)this,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  sVar3 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(this_00);
  if (sVar3 != 0) {
    tname.field_2._8_8_ = std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
    while( true ) {
      mname.field_2._8_8_ = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)((long)&tname.field_2 + 8),
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)((long)&mname.field_2 + 8));
      if (!bVar1) break;
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&tname.field_2 + 8));
      psVar5 = t_field::get_name_abi_cxx11_(*pptVar4);
      std::__cxx11::string::string((string *)(type.field_2._M_local_buf + 8),(string *)psVar5);
      t_generator::decapitalize
                ((string *)local_e0,(t_generator *)this,(string *)((long)&type.field_2 + 8));
      std::__cxx11::string::~string((string *)(type.field_2._M_local_buf + 8));
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&tname.field_2 + 8));
      type_00 = t_field::get_type(*pptVar4);
      render_ocaml_type_abi_cxx11_((string *)local_120,this,type_00);
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"method get_");
      poVar2 = std::operator<<(poVar2,(string *)local_e0);
      poVar2 = std::operator<<(poVar2," : ");
      poVar2 = std::operator<<(poVar2,(string *)local_120);
      poVar2 = std::operator<<(poVar2," option");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"method grab_");
      poVar2 = std::operator<<(poVar2,(string *)local_e0);
      poVar2 = std::operator<<(poVar2," : ");
      poVar2 = std::operator<<(poVar2,(string *)local_120);
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"method set_");
      poVar2 = std::operator<<(poVar2,(string *)local_e0);
      poVar2 = std::operator<<(poVar2," : ");
      poVar2 = std::operator<<(poVar2,(string *)local_120);
      poVar2 = std::operator<<(poVar2," -> unit");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)((long)&tname.field_2 + 8));
      bVar1 = struct_member_persistent(this,*pptVar4);
      if (!bVar1) {
        poVar2 = t_generator::indent((t_generator *)this,out);
        poVar2 = std::operator<<(poVar2,"method unset_");
        poVar2 = std::operator<<(poVar2,(string *)local_e0);
        poVar2 = std::operator<<(poVar2," : unit");
        std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      }
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"method reset_");
      poVar2 = std::operator<<(poVar2,(string *)local_e0);
      poVar2 = std::operator<<(poVar2," : unit");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)local_120);
      std::__cxx11::string::~string((string *)local_e0);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)((long)&tname.field_2 + 8));
    }
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"method copy : \'a");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"method write : Protocol.t -> unit");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"end");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  if (is_exception) {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"exception ");
    std::__cxx11::string::string((string *)&local_160,(string *)local_58);
    t_generator::capitalize(&local_140,(t_generator *)this,&local_160);
    poVar2 = std::operator<<(poVar2,(string *)&local_140);
    poVar2 = std::operator<<(poVar2," of ");
    poVar2 = std::operator<<(poVar2,(string *)local_58);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"val read_");
  poVar2 = std::operator<<(poVar2,(string *)local_58);
  poVar2 = std::operator<<(poVar2," : Protocol.t -> ");
  poVar2 = std::operator<<(poVar2,(string *)local_58);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void t_ocaml_generator::generate_ocaml_struct_sig(ostream& out,
                                                  t_struct* tstruct,
                                                  bool is_exception) {
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;
  string tname = type_name(tstruct);
  indent(out) << "class " << tname << " :" << endl;
  indent(out) << "object ('a)" << endl;

  indent_up();

  string x = tmp("_x");
  if (members.size() > 0) {
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      string mname = decapitalize((*m_iter)->get_name());
      string type = render_ocaml_type((*m_iter)->get_type());
      indent(out) << "method get_" << mname << " : " << type << " option" << endl;
      indent(out) << "method grab_" << mname << " : " << type << endl;
      indent(out) << "method set_" << mname << " : " << type << " -> unit" << endl;
      if (!struct_member_persistent(*m_iter))
        indent(out) << "method unset_" << mname << " : unit" << endl;
      indent(out) << "method reset_" << mname << " : unit" << endl;
    }
  }
  indent(out) << "method copy : 'a" << endl;
  indent(out) << "method write : Protocol.t -> unit" << endl;
  indent_down();
  indent(out) << "end" << endl;

  if (is_exception) {
    indent(out) << "exception " << capitalize(tname) << " of " << tname << endl;
  }

  indent(out) << "val read_" << tname << " : Protocol.t -> " << tname << endl;
}